

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void cs_impl::hash_map_cs_ext::insert(hash_map *map,var *key,var *val)

{
  MappedReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> this;
  any *this_00;
  const_iterator cVar1;
  any local_70;
  any local_68;
  any local_60;
  any local_58;
  any local_50;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_48;
  hash_map *local_30;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_28;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_20;
  
  cVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::find<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                      *)map,key);
  if (cVar1.inner_.ctrl_ ==
      (map->
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ).
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      .ctrl_ + (map->
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               ).
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               .capacity_) {
    local_60.mDat = key->mDat;
    if (local_60.mDat != (proxy *)0x0) {
      (local_60.mDat)->refcount = (local_60.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)&local_60);
    local_70.mDat = val->mDat;
    if (local_70.mDat != (proxy *)0x0) {
      (local_70.mDat)->refcount = (local_70.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&local_68,(EVP_PKEY_CTX *)&local_70);
    local_30 = map;
    local_28._M_head_impl = &local_58;
    local_20._M_head_impl = &local_68;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
    ::EmplaceDecomposable::operator()
              (&local_48,&local_30,&local_58,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<cs_impl::any_&&> *)&local_28,(tuple<cs_impl::any_&&> *)&local_20);
    any::recycle(&local_68);
    any::recycle(&local_70);
    any::recycle(&local_58);
    this_00 = &local_60;
  }
  else {
    this = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
           ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                       *)map,key);
    local_50.mDat = val->mDat;
    if (local_50.mDat != (proxy *)0x0) {
      (local_50.mDat)->refcount = (local_50.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)&local_50);
    any::swap(this,(any *)&local_48,true);
    any::recycle((any *)&local_48);
    this_00 = &local_50;
  }
  any::recycle(this_00);
  return;
}

Assistant:

void insert(hash_map &map, const var &key, const var &val)
		{
			if (map.count(key) > 0)
				map.at(key).swap(copy(val), true);
			else
				map.emplace(copy(key), copy(val));
		}